

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O2

PCRE2_UCHAR16 get_repeat_base(PCRE2_UCHAR16 c)

{
  PCRE2_UCHAR16 PVar1;
  
  PVar1 = c;
  if ((((c < 0x62) && (PVar1 = 0x55, c < 0x55)) && (PVar1 = 0x48, c < 0x48)) &&
     (PVar1 = 0x3b, c < 0x3b)) {
    PVar1 = 0x2e;
    if (c < 0x2e) {
      PVar1 = 0x21;
    }
    return PVar1;
  }
  return PVar1;
}

Assistant:

static PCRE2_UCHAR
get_repeat_base(PCRE2_UCHAR c)
{
return (c > OP_TYPEPOSUPTO)? c :
       (c >= OP_TYPESTAR)?   OP_TYPESTAR :
       (c >= OP_NOTSTARI)?   OP_NOTSTARI :
       (c >= OP_NOTSTAR)?    OP_NOTSTAR :
       (c >= OP_STARI)?      OP_STARI :
                             OP_STAR;
}